

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21e63::TestCorrectlyReportsFixturesWithCtorsThatAssert::
~TestCorrectlyReportsFixturesWithCtorsThatAssert
          (TestCorrectlyReportsFixturesWithCtorsThatAssert *this)

{
  TestCorrectlyReportsFixturesWithCtorsThatAssert *this_local;
  
  ~TestCorrectlyReportsFixturesWithCtorsThatAssert(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CorrectlyReportsFixturesWithCtorsThatAssert)
{
	RecordingReporter reporter;
	TestResults result(&reporter);
	{
		ScopedCurrentTest scopedResults(result);
		ctorAssertFixtureTestList.GetHead()->Run();
	}

	const int failureCount = result.GetFailedTestCount();
	CHECK_EQUAL(1, failureCount);
	CHECK_EQUAL(FailingLine, reporter.lastFailedLine);
	CHECK(strstr(reporter.lastFailedMessage, "assert failure"));
}